

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalysis.cpp
# Opt level: O0

void __thiscall TPZAnalysis::Read(TPZAnalysis *this,TPZStream *buf,void *context)

{
  ESolType EVar1;
  TPZSavable *pTVar2;
  TPZAutoPointer<TPZSavable> *in;
  long *in_RSI;
  long in_RDI;
  TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff18;
  TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *vec;
  TPZStream *in_stack_ffffffffffffff20;
  int64_t *this_00;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined4 uVar3;
  TPZSolutionMatrix *in_stack_ffffffffffffff30;
  TTablePostProcess *this_01;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_88;
  undefined8 local_78;
  TPZVec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_60;
  long *local_20;
  long *local_10;
  
  local_10 = in_RSI;
  pTVar2 = TPZPersistenceManager::GetInstance(in_stack_ffffffffffffff20);
  if (pTVar2 == (TPZSavable *)0x0) {
    local_78 = 0;
  }
  else {
    local_78 = __dynamic_cast(pTVar2,&TPZSavable::typeinfo,&TPZGeoMesh::typeinfo,0);
  }
  *(undefined8 *)(in_RDI + 8) = local_78;
  pTVar2 = TPZPersistenceManager::GetInstance(in_stack_ffffffffffffff20);
  if (pTVar2 == (TPZSavable *)0x0) {
    local_88 = 0;
  }
  else {
    local_88 = __dynamic_cast(pTVar2,&TPZSavable::typeinfo,&TPZCompMesh::typeinfo,0xffffffffffffffff
                             );
  }
  *(undefined8 *)(in_RDI + 0x10) = local_88;
  pTVar2 = TPZPersistenceManager::GetInstance(in_stack_ffffffffffffff20);
  if (pTVar2 == (TPZSavable *)0x0) {
    in = (TPZAutoPointer<TPZSavable> *)0x0;
  }
  else {
    in = (TPZAutoPointer<TPZSavable> *)
         __dynamic_cast(pTVar2,&TPZSavable::typeinfo,&TPZGraphMesh::typeinfo,0);
  }
  *(TPZAutoPointer<TPZSavable> **)(in_RDI + 0x20) = in;
  pTVar2 = TPZPersistenceManager::GetInstance(in_stack_ffffffffffffff20);
  if (pTVar2 == (TPZSavable *)0x0) {
    local_a8 = 0;
  }
  else {
    local_a8 = __dynamic_cast(pTVar2,&TPZSavable::typeinfo,&TPZGraphMesh::typeinfo,0);
  }
  *(undefined8 *)(in_RDI + 0x28) = local_a8;
  pTVar2 = TPZPersistenceManager::GetInstance(in_stack_ffffffffffffff20);
  if (pTVar2 == (TPZSavable *)0x0) {
    local_b8 = 0;
  }
  else {
    local_b8 = __dynamic_cast(pTVar2,&TPZSavable::typeinfo,&TPZGraphMesh::typeinfo,0);
  }
  *(undefined8 *)(in_RDI + 0x30) = local_b8;
  local_20 = local_10;
  EVar1 = Read::anon_class_8_1_ba1d39d3::operator()
                    ((anon_class_8_1_ba1d39d3 *)in_stack_ffffffffffffff20);
  *(ESolType *)(in_RDI + 0x18) = EVar1;
  TPZSolutionMatrix::Read
            (in_stack_ffffffffffffff30,
             (TPZStream *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
             in_stack_ffffffffffffff20);
  pTVar2 = TPZPersistenceManager::GetInstance(in_stack_ffffffffffffff20);
  if (pTVar2 == (TPZSavable *)0x0) {
    local_c8 = 0;
  }
  else {
    local_c8 = __dynamic_cast(pTVar2,&TPZSavable::typeinfo,&TPZMatrixSolver<double>::typeinfo,0);
  }
  *(undefined8 *)(in_RDI + 0x170) = local_c8;
  TPZStream::Read<std::__cxx11::string>(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  TPZStream::Read<std::__cxx11::string>(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  TPZStream::Read<std::__cxx11::string>(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  TPZStream::Read<std::__cxx11::string>(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  TPZStream::Read<std::__cxx11::string>(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  TPZStream::Read<std::__cxx11::string>(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  uVar3 = 1;
  (**(code **)(*local_10 + 0xe8))(local_10,in_RDI + 0x298);
  (**(code **)(*local_10 + 0xe8))(local_10,in_RDI + 0x29c,uVar3);
  this_01 = (TTablePostProcess *)&stack0xffffffffffffffd0;
  TPZPersistenceManager::GetAutoPointer((TPZStream *)CONCAT44(uVar3,in_stack_ffffffffffffff28));
  TPZAutoPointerDynamicCast<TPZStructMatrix,TPZSavable>(in);
  TPZAutoPointer<TPZStructMatrix>::operator=
            ((TPZAutoPointer<TPZStructMatrix> *)in_stack_ffffffffffffff20,
             (TPZAutoPointer<TPZStructMatrix> *)in_stack_ffffffffffffff18);
  TPZAutoPointer<TPZStructMatrix>::~TPZAutoPointer
            ((TPZAutoPointer<TPZStructMatrix> *)in_stack_ffffffffffffff20);
  TPZAutoPointer<TPZSavable>::~TPZAutoPointer
            ((TPZAutoPointer<TPZSavable> *)in_stack_ffffffffffffff20);
  this_00 = &local_60.fNElements;
  TPZPersistenceManager::GetAutoPointer((TPZStream *)CONCAT44(uVar3,in_stack_ffffffffffffff28));
  TPZAutoPointerDynamicCast<TPZRenumbering,TPZSavable>(in);
  TPZAutoPointer<TPZRenumbering>::operator=
            ((TPZAutoPointer<TPZRenumbering> *)this_00,
             (TPZAutoPointer<TPZRenumbering> *)in_stack_ffffffffffffff18);
  TPZAutoPointer<TPZRenumbering>::~TPZAutoPointer((TPZAutoPointer<TPZRenumbering> *)this_00);
  TPZAutoPointer<TPZSavable>::~TPZAutoPointer((TPZAutoPointer<TPZSavable> *)this_00);
  vec = &local_60;
  TPZPersistenceManager::GetAutoPointer((TPZStream *)CONCAT44(uVar3,in_stack_ffffffffffffff28));
  TPZAutoPointerDynamicCast<TPZGuiInterface,TPZSavable>(in);
  TPZAutoPointer<TPZGuiInterface>::operator=
            ((TPZAutoPointer<TPZGuiInterface> *)this_00,(TPZAutoPointer<TPZGuiInterface> *)vec);
  TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer((TPZAutoPointer<TPZGuiInterface> *)this_00);
  TPZAutoPointer<TPZSavable>::~TPZAutoPointer((TPZAutoPointer<TPZSavable> *)this_00);
  TTablePostProcess::Read(this_01,(TPZStream *)CONCAT44(uVar3,in_stack_ffffffffffffff28),this_00);
  TPZStream::Read<std::__cxx11::string>((TPZStream *)this_00,vec);
  TPZStream::Read<std::__cxx11::string>((TPZStream *)this_00,vec);
  TPZStream::Read<std::__cxx11::string>((TPZStream *)this_00,vec);
  return;
}

Assistant:

void TPZAnalysis::Read(TPZStream &buf, void *context){
    fGeoMesh = dynamic_cast<TPZGeoMesh*>(TPZPersistenceManager::GetInstance(&buf));
    fCompMesh = dynamic_cast<TPZCompMesh*>(TPZPersistenceManager::GetInstance(&buf));
    fGraphMesh[0] = dynamic_cast<TPZGraphMesh*>(TPZPersistenceManager::GetInstance(&buf));
    fGraphMesh[1] = dynamic_cast<TPZGraphMesh*>(TPZPersistenceManager::GetInstance(&buf));
    fGraphMesh[2] = dynamic_cast<TPZGraphMesh*>(TPZPersistenceManager::GetInstance(&buf));
    fSolType = [&buf](){
        int tmp;
        buf.Read(&tmp);
        return (ESolType) tmp;
    }();
    fSolution.Read(buf,context);
    fSolver = dynamic_cast<TPZMatrixSolver<STATE>*>(TPZPersistenceManager::GetInstance(&buf));
    buf.Read(fScalarNames[0]);
    buf.Read(fScalarNames[1]);
    buf.Read(fScalarNames[2]);
    buf.Read(fVectorNames[0]);
    buf.Read(fVectorNames[1]);
    buf.Read(fVectorNames[2]);
    buf.Read(&fStep);
    buf.Read(&fNthreadsError);
    fStructMatrix = TPZAutoPointerDynamicCast<TPZStructMatrix>(TPZPersistenceManager::GetAutoPointer(&buf));
    fRenumber = TPZAutoPointerDynamicCast<TPZRenumbering>(TPZPersistenceManager::GetAutoPointer(&buf));
    fGuiInterface = TPZAutoPointerDynamicCast<TPZGuiInterface>(TPZPersistenceManager::GetAutoPointer(&buf));
    fTable.Read(buf,context);
    buf.Read(fTensorNames[0]);
    buf.Read(fTensorNames[1]);
    buf.Read(fTensorNames[2]);
}